

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

bool testing::internal::
     TypeParameterizedTestSuite<bssl::PkitsTest09RequireExplicitPolicy,_testing::internal::Templates<bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidRequireExplicitPolicyTest5,_bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9ValidSelfIssuedrequireExplicitPolicyTest6,_bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest7,_bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest8>,_testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>_>
     ::Register(char *prefix,CodeLocation *code_location,TypedTestSuitePState *state,char *case_name
               ,char *test_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  byte *pbVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Alloc_hider _Var4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  const_iterator cVar9;
  CodeLocation *pCVar10;
  long *plVar11;
  size_t sVar12;
  TestFactoryBase *pTVar13;
  undefined8 *puVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  undefined8 extraout_RAX_00;
  internal *piVar15;
  ulong *puVar16;
  size_type *psVar17;
  type_info *extraout_RDX;
  type_info *extraout_RDX_00;
  type_info *extraout_RDX_01;
  type_info *extraout_RDX_02;
  type_info *extraout_RDX_03;
  type_info *extraout_RDX_04;
  type_info *extraout_RDX_05;
  type_info *extraout_RDX_06;
  type_info *extraout_RDX_07;
  type_info *extraout_RDX_08;
  type_info *extraout_RDX_09;
  type_info *extraout_RDX_10;
  type_info *extraout_RDX_11;
  type_info *extraout_RDX_12;
  type_info *extraout_RDX_13;
  type_info *extraout_RDX_14;
  type_info *ptVar18;
  ulong uVar19;
  char *pcVar20;
  char *pcVar21;
  CodeLocation *pCVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  _Alloc_hider _Var24;
  size_type __dnew_1;
  size_type __dnew;
  size_type __dnew_2;
  size_type __dnew_3;
  string test_name;
  string test_name_1;
  string test_name_2;
  string test_name_3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  GTestLog local_394;
  string local_390;
  string local_370;
  int local_350;
  string local_348;
  CodeLocation local_328;
  internal *local_300;
  pointer local_2f8;
  pointer local_2f0;
  long lStack_2e8;
  uint local_2e0;
  string local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b8;
  long local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  int local_298;
  internal *local_290;
  pointer local_288;
  pointer local_280;
  long lStack_278;
  uint local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  pointer local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  CodeLocation *local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240;
  long local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  int local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  TypedTestSuitePState *local_1f8;
  string local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  int local_1b0;
  internal *local_1a8;
  pointer local_1a0;
  pointer local_198;
  long lStack_190;
  uint local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  long local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  int local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  CodeLocation *local_118;
  size_type local_110;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  key_type local_d0;
  key_type local_b0;
  undefined1 local_90 [17];
  undefined7 uStack_7f;
  undefined8 uStack_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  local_1f8 = state;
  RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest09RequireExplicitPolicy");
  pcVar8 = strchr((char *)code_location,0x2c);
  if (pcVar8 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,(char *)code_location,(allocator<char> *)&local_328);
  }
  else {
    local_158 = &local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,code_location,pcVar8);
  }
  local_d0._M_dataplus._M_p = (pointer)local_158;
  local_248 = code_location;
  if (local_150 != 0) {
    pcVar8 = local_158->_M_local_buf + local_150;
    do {
      paVar23 = local_158;
      iVar7 = isspace((uint)(byte)pcVar8[-1]);
      local_d0._M_dataplus._M_p = (pointer)paVar23;
      if (iVar7 == 0) break;
      pcVar20 = pcVar8 + -1;
      uVar19 = (long)pcVar20 - (long)paVar23;
      std::__cxx11::string::_M_erase((ulong)&local_158,uVar19);
      pcVar8 = local_158->_M_local_buf + uVar19;
      local_d0._M_dataplus._M_p = (pointer)local_158;
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pcVar20 != paVar23);
  }
  local_158 = &local_148;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == local_158) {
    local_d0.field_2._8_8_ = local_148._8_8_;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  local_d0.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_d0.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_d0._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                  *)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 8),
                 &local_d0);
  iVar7 = 0x6e2130;
  if (cVar9._M_node ==
      (_Base_ptr)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 0x10)) {
    FormatFileLocation_abi_cxx11_
              (&local_328.file,*(internal **)prefix,(char *)(ulong)*(uint *)(prefix + 0x20),0x6e2130
              );
    TypeParameterizedTestSuite<bssl::PkitsTest09RequireExplicitPolicy,testing::internal::Templates<bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidRequireExplicitPolicyTest5,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9ValidSelfIssuedrequireExplicitPolicyTest6,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest7,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest8>,testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
    ::Register();
LAB_003fc661:
    FormatFileLocation_abi_cxx11_(&local_328.file,local_1a8,(char *)(ulong)local_188,iVar7);
    TypeParameterizedTestSuite<bssl::PkitsTest09RequireExplicitPolicy,testing::internal::Templates<bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidRequireExplicitPolicyTest5,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9ValidSelfIssuedrequireExplicitPolicyTest6,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest7,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest8>,testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
    ::Register();
  }
  else {
    pCVar10 = TypedTestSuitePState::GetCodeLocation
                        ((TypedTestSuitePState *)
                         bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_,
                         &local_d0);
    local_180 = &local_170;
    pcVar2 = (pCVar10->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_180,pcVar2,pcVar2 + (pCVar10->file)._M_string_length);
    local_160 = pCVar10->line;
    local_290 = (internal *)&local_280;
    local_348._M_dataplus._M_p = (pointer)0x16;
    local_290 = (internal *)std::__cxx11::string::_M_create((ulong *)&local_290,(ulong)&local_348);
    local_280 = local_348._M_dataplus._M_p;
    *(undefined8 *)local_290 = 0x6543796669726556;
    *(undefined8 *)(local_290 + 8) = 0x7461636966697472;
    *(undefined8 *)(local_290 + 0xe) = 0x6e69616843657461;
    local_288 = local_348._M_dataplus._M_p;
    local_290[(long)local_348._M_dataplus._M_p] = (internal)0x0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_290);
    pCVar10 = local_248;
    local_240 = &local_230;
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar23) {
      local_230._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_230._8_8_ = plVar11[3];
    }
    else {
      local_230._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_240 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11;
    }
    local_238 = plVar11[1];
    *plVar11 = (long)paVar23;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_240);
    local_300 = (internal *)&local_2f0;
    piVar15 = (internal *)(plVar11 + 2);
    if ((internal *)*plVar11 == piVar15) {
      local_2f0 = *(pointer *)piVar15;
      lStack_2e8 = plVar11[3];
    }
    else {
      local_2f0 = *(pointer *)piVar15;
      local_300 = (internal *)*plVar11;
    }
    local_2f8 = (pointer)plVar11[1];
    *plVar11 = (long)piVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_300);
    local_2b8 = &local_2a8;
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar23) {
      local_2a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_2a8._8_8_ = plVar11[3];
    }
    else {
      local_2a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11;
    }
    local_2b0 = plVar11[1];
    *plVar11 = (long)paVar23;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_2b8,**(ulong **)local_1f8);
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    puVar16 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_370.field_2._M_allocated_capacity = *puVar16;
      local_370.field_2._8_8_ = plVar11[3];
    }
    else {
      local_370.field_2._M_allocated_capacity = *puVar16;
      local_370._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_370._M_string_length = plVar11[1];
    *plVar11 = (long)puVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    pcVar8 = strchr((char *)pCVar10,0x2c);
    if (pcVar8 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b8,(char *)pCVar10,(allocator<char> *)&local_390);
      ptVar18 = extraout_RDX_00;
    }
    else {
      local_3b8 = &local_3a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,pCVar10,pcVar8);
      ptVar18 = extraout_RDX;
    }
    paVar23 = local_3b8;
    if (local_3b0 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar8 = local_3b0->_M_local_buf + (long)local_3b8;
      do {
        paVar3 = local_3b8;
        iVar7 = isspace((uint)(byte)pcVar8[-1]);
        ptVar18 = extraout_RDX_01;
        paVar23 = paVar3;
        if (iVar7 == 0) break;
        pcVar20 = pcVar8 + -1;
        uVar19 = (long)pcVar20 - (long)paVar3;
        std::__cxx11::string::_M_erase((ulong)&local_3b8,uVar19);
        pcVar8 = local_3b8->_M_local_buf + uVar19;
        ptVar18 = extraout_RDX_02;
        paVar23 = local_3b8;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pcVar20 != paVar3);
    }
    local_3b8 = &local_3a8;
    if (paVar23 == local_3b8) {
      local_348.field_2._8_8_ = local_3a8._8_8_;
      paVar23 = &local_348.field_2;
    }
    local_348.field_2._M_allocated_capacity = local_3a8._M_allocated_capacity;
    local_348._M_string_length = (size_type)local_3b0;
    local_3b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    local_3a8._M_allocated_capacity = local_3a8._M_allocated_capacity & 0xffffffffffffff00;
    local_348._M_dataplus._M_p = (pointer)paVar23;
    GetTypeName_abi_cxx11_
              (&local_390,
               (internal *)
               &bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate::typeinfo,
               ptVar18);
    _Var24._M_p = local_390._M_dataplus._M_p;
    local_328.file._M_dataplus._M_p = (pointer)&local_328.file.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_328,local_180,local_178 + (long)local_180);
    iVar7 = local_160;
    paVar3 = local_180;
    local_328.line = local_160;
    bVar6 = IsTrue(true);
    if (!bVar6) {
      GTestLog::GTestLog((GTestLog *)&local_2d8,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x201);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                 ,0x6a);
      if (paVar3 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
      }
      else {
        sVar12 = strlen(paVar3->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar3->_M_local_buf,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      GTestLog::~GTestLog((GTestLog *)&local_2d8);
    }
    iVar7 = local_160;
    paVar3 = local_180;
    bVar6 = IsTrue(true);
    if (!bVar6) {
      GTestLog::GTestLog((GTestLog *)&local_2d8,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x216);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                 ,0x6f);
      if (paVar3 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
      }
      else {
        sVar12 = strlen(paVar3->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar3->_M_local_buf,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      GTestLog::~GTestLog((GTestLog *)&local_2d8);
    }
    pTVar13 = (TestFactoryBase *)operator_new(8);
    pTVar13->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006cbbe8;
    MakeAndRegisterTestInfo
              (&local_370,paVar23->_M_local_buf,_Var24._M_p,(char *)0x0,&local_328,
               &TypeIdHelper<bssl::PkitsTest09RequireExplicitPolicy<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
                ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328.file._M_dataplus._M_p != &local_328.file.field_2) {
      operator_delete(local_328.file._M_dataplus._M_p,
                      local_328.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,local_3a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,local_2a8._M_allocated_capacity + 1);
    }
    if (local_300 != (internal *)&local_2f0) {
      operator_delete(local_300,(ulong)(local_2f0 + 1));
    }
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230._M_allocated_capacity + 1);
    }
    if (local_290 != (internal *)&local_280) {
      operator_delete(local_290,(ulong)(local_280 + 1));
    }
    if (local_180 == &local_170) {
      local_1c0._8_8_ = local_170._8_8_;
      local_180 = &local_1c0;
    }
    local_1c0._M_allocated_capacity._1_7_ = local_170._M_allocated_capacity._1_7_;
    local_1c0._M_local_buf[0] = local_170._M_local_buf[0];
    local_1c8 = local_178;
    local_178 = 0;
    local_170._M_local_buf[0] = '\0';
    local_1b0 = local_160;
    pCVar10 = local_248;
    local_1d0 = local_180;
    paVar23 = &local_170;
    if ((local_180 != &local_1c0) &&
       (paVar23 = local_180, local_180 = &local_170,
       operator_delete(paVar23,local_1c0._M_allocated_capacity + 1), pCVar10 = local_248,
       paVar23 = local_180, local_180 != &local_170)) {
      operator_delete(local_180,
                      CONCAT71(local_170._M_allocated_capacity._1_7_,local_170._M_local_buf[0]) + 1)
      ;
      paVar23 = local_180;
    }
    local_180 = paVar23;
    local_1a8 = (internal *)&local_198;
    piVar15 = (internal *)(prefix + 0x10);
    if (*(internal **)prefix == piVar15) {
      local_198 = *(pointer *)piVar15;
      lStack_190 = *(long *)(prefix + 0x18);
    }
    else {
      local_198 = *(pointer *)piVar15;
      local_1a8 = *(internal **)prefix;
    }
    local_1a0 = *(pointer *)(prefix + 8);
    *(internal **)prefix = piVar15;
    prefix[8] = '\0';
    prefix[9] = '\0';
    prefix[10] = '\0';
    prefix[0xb] = '\0';
    prefix[0xc] = '\0';
    prefix[0xd] = '\0';
    prefix[0xe] = '\0';
    prefix[0xf] = '\0';
    prefix[0x10] = '\0';
    local_188 = *(uint *)(prefix + 0x20);
    pcVar8 = strchr((char *)pCVar10,0x2c);
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(pcVar8 + 1);
        pcVar8 = pcVar8 + 1;
        iVar7 = isspace((uint)*pbVar1);
      } while (iVar7 != 0);
    }
    RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest09RequireExplicitPolicy");
    pcVar20 = strchr(pcVar8,0x2c);
    if (pcVar20 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,pcVar8,(allocator<char> *)&local_328);
    }
    else {
      local_138 = &local_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,pcVar8,pcVar20);
    }
    local_b0._M_dataplus._M_p = (pointer)local_138;
    if (local_130 != 0) {
      pcVar20 = local_138->_M_local_buf + local_130;
      do {
        paVar23 = local_138;
        iVar7 = isspace((uint)(byte)pcVar20[-1]);
        local_b0._M_dataplus._M_p = (pointer)paVar23;
        if (iVar7 == 0) break;
        pcVar21 = pcVar20 + -1;
        uVar19 = (long)pcVar21 - (long)paVar23;
        std::__cxx11::string::_M_erase((ulong)&local_138,uVar19);
        pcVar20 = local_138->_M_local_buf + uVar19;
        local_b0._M_dataplus._M_p = (pointer)local_138;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pcVar21 != paVar23);
    }
    local_138 = &local_128;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == local_138) {
      local_b0.field_2._8_8_ = local_128._8_8_;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    local_b0.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
    local_b0.field_2._M_local_buf[0] = local_128._M_local_buf[0];
    local_b0._M_string_length = local_130;
    local_130 = 0;
    local_128._M_local_buf[0] = '\0';
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                    *)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 8),
                   &local_b0);
    iVar7 = 0x6e2130;
    if (cVar9._M_node ==
        (_Base_ptr)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 0x10))
    goto LAB_003fc661;
    pCVar10 = TypedTestSuitePState::GetCodeLocation
                        ((TypedTestSuitePState *)
                         bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_,
                         &local_b0);
    local_240 = &local_230;
    pcVar2 = (pCVar10->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_240,pcVar2,pcVar2 + (pCVar10->file)._M_string_length);
    local_220 = pCVar10->line;
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    local_3b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x16;
    local_348._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_348,(ulong)&local_3b8);
    local_348.field_2._M_allocated_capacity = (size_type)local_3b8;
    *(undefined8 *)local_348._M_dataplus._M_p = 0x6543796669726556;
    *(undefined8 *)((long)local_348._M_dataplus._M_p + 8) = 0x7461636966697472;
    builtin_strncpy((char *)((long)local_348._M_dataplus._M_p + 0xe),"ateChain",8);
    local_348._M_string_length = (size_type)local_3b8;
    local_348._M_dataplus._M_p[(long)local_3b8] = '\0';
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_348);
    local_290 = (internal *)&local_280;
    piVar15 = (internal *)(plVar11 + 2);
    if ((internal *)*plVar11 == piVar15) {
      local_280 = *(pointer *)piVar15;
      lStack_278 = plVar11[3];
    }
    else {
      local_280 = *(pointer *)piVar15;
      local_290 = (internal *)*plVar11;
    }
    local_288 = (pointer)plVar11[1];
    *plVar11 = (long)piVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_290);
    local_300 = (internal *)&local_2f0;
    piVar15 = (internal *)(plVar11 + 2);
    if ((internal *)*plVar11 == piVar15) {
      local_2f0 = *(pointer *)piVar15;
      lStack_2e8 = plVar11[3];
    }
    else {
      local_2f0 = *(pointer *)piVar15;
      local_300 = (internal *)*plVar11;
    }
    local_2f8 = (pointer)plVar11[1];
    *plVar11 = (long)piVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_300);
    local_2b8 = &local_2a8;
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar23) {
      local_2a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_2a8._8_8_ = plVar11[3];
    }
    else {
      local_2a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11;
    }
    local_2b0 = plVar11[1];
    *plVar11 = (long)paVar23;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_2b8,**(ulong **)local_1f8);
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    puVar16 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_370.field_2._M_allocated_capacity = *puVar16;
      local_370.field_2._8_8_ = plVar11[3];
    }
    else {
      local_370.field_2._M_allocated_capacity = *puVar16;
      local_370._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_370._M_string_length = plVar11[1];
    *plVar11 = (long)puVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    pcVar20 = strchr(pcVar8,0x2c);
    if (pcVar20 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_390,pcVar8,(allocator<char> *)&local_2d8);
      ptVar18 = extraout_RDX_04;
    }
    else {
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,pcVar8,pcVar20);
      ptVar18 = extraout_RDX_03;
    }
    _Var24._M_p = local_390._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_string_length !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar20 = (char *)(local_390._M_string_length + (long)local_390._M_dataplus._M_p);
      do {
        _Var4._M_p = local_390._M_dataplus._M_p;
        iVar7 = isspace((uint)(byte)pcVar20[-1]);
        ptVar18 = extraout_RDX_05;
        _Var24._M_p = _Var4._M_p;
        if (iVar7 == 0) break;
        pcVar21 = pcVar20 + -1;
        uVar19 = (long)pcVar21 - (long)_Var4._M_p;
        std::__cxx11::string::_M_erase((ulong)&local_390,uVar19);
        pcVar20 = local_390._M_dataplus._M_p + uVar19;
        ptVar18 = extraout_RDX_06;
        _Var24._M_p = local_390._M_dataplus._M_p;
      } while (pcVar21 != _Var4._M_p);
    }
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    if (_Var24._M_p == local_390._M_dataplus._M_p) {
      local_3a8._8_8_ = local_390.field_2._8_8_;
      _Var24._M_p = (pointer)&local_3a8;
    }
    local_3a8._M_allocated_capacity = local_390.field_2._M_allocated_capacity;
    local_3b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_390._M_string_length;
    local_390._M_string_length = 0;
    local_390.field_2._M_allocated_capacity =
         local_390.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_3b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var24._M_p;
    GetTypeName_abi_cxx11_
              (&local_2d8,
               (internal *)
               &bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate::typeinfo,
               ptVar18);
    _Var4._M_p = local_2d8._M_dataplus._M_p;
    local_328.file._M_dataplus._M_p = (pointer)&local_328.file.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_328,local_240,local_238 + (long)local_240);
    iVar7 = local_220;
    paVar23 = local_240;
    local_328.line = local_220;
    bVar6 = IsTrue(true);
    if (!bVar6) {
      GTestLog::GTestLog((GTestLog *)&local_268,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x201);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                 ,0x6a);
      if (paVar23 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
      }
      else {
        sVar12 = strlen(paVar23->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar23->_M_local_buf,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      GTestLog::~GTestLog((GTestLog *)&local_268);
    }
    iVar7 = local_220;
    paVar23 = local_240;
    bVar6 = IsTrue(true);
    if (!bVar6) {
      GTestLog::GTestLog((GTestLog *)&local_268,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x216);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                 ,0x6f);
      if (paVar23 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
      }
      else {
        sVar12 = strlen(paVar23->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar23->_M_local_buf,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      GTestLog::~GTestLog((GTestLog *)&local_268);
    }
    pTVar13 = (TestFactoryBase *)operator_new(8);
    pTVar13->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006cbcd8;
    MakeAndRegisterTestInfo
              (&local_370,_Var24._M_p,_Var4._M_p,(char *)0x0,&local_328,
               &TypeIdHelper<bssl::PkitsTest09RequireExplicitPolicy<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
                ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328.file._M_dataplus._M_p != &local_328.file.field_2) {
      operator_delete(local_328.file._M_dataplus._M_p,
                      local_328.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,local_3a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,local_2a8._M_allocated_capacity + 1);
    }
    if (local_300 != (internal *)&local_2f0) {
      operator_delete(local_300,(ulong)(local_2f0 + 1));
    }
    if (local_290 != (internal *)&local_280) {
      operator_delete(local_290,(ulong)(local_280 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    uVar5 = local_230._M_allocated_capacity;
    if (local_240 == &local_230) {
      local_1c0._8_8_ = local_230._8_8_;
      local_240 = &local_1c0;
    }
    local_1c0._M_allocated_capacity = local_230._M_allocated_capacity;
    local_1c8 = local_238;
    local_238 = 0;
    local_230._M_allocated_capacity = local_230._M_allocated_capacity & 0xffffffffffffff00;
    local_1b0 = local_220;
    paVar23 = &local_230;
    local_1d0 = local_240;
    if ((local_240 != &local_1c0) &&
       (local_240 = &local_230, operator_delete(local_1d0,uVar5 + 1), paVar23 = local_240,
       local_240 != &local_230)) {
      operator_delete(local_240,local_230._M_allocated_capacity + 1);
      paVar23 = local_240;
    }
    local_240 = paVar23;
    local_290 = (internal *)&local_280;
    if (local_1a8 == (internal *)&local_198) {
      lStack_278 = lStack_190;
    }
    else {
      local_290 = local_1a8;
    }
    local_280 = local_198;
    local_288 = local_1a0;
    local_1a0 = (pointer)0x0;
    local_198 = (pointer)((ulong)local_198 & 0xffffffffffffff00);
    local_270 = local_188;
    local_1a8 = (internal *)&local_198;
    pcVar8 = strchr(pcVar8,0x2c);
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(pcVar8 + 1);
        pcVar8 = pcVar8 + 1;
        iVar7 = isspace((uint)*pbVar1);
      } while (iVar7 != 0);
    }
    RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest09RequireExplicitPolicy");
    pcVar20 = strchr(pcVar8,0x2c);
    if (pcVar20 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,pcVar8,(allocator<char> *)&local_328);
    }
    else {
      local_118 = (CodeLocation *)local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,pcVar8,pcVar20);
    }
    local_90._0_8_ = local_118;
    if (local_110 != 0) {
      pcVar20 = (char *)((long)&(local_118->file)._M_dataplus._M_p + local_110);
      do {
        pCVar10 = local_118;
        iVar7 = isspace((uint)(byte)pcVar20[-1]);
        local_90._0_8_ = pCVar10;
        if (iVar7 == 0) break;
        pCVar22 = (CodeLocation *)(pcVar20 + -1);
        uVar19 = (long)pCVar22 - (long)pCVar10;
        std::__cxx11::string::_M_erase((ulong)&local_118,uVar19);
        pcVar20 = (char *)(uVar19 + (long)local_118);
        local_90._0_8_ = local_118;
      } while (pCVar22 != pCVar10);
    }
    local_248 = (CodeLocation *)(local_90 + 0x10);
    local_118 = (CodeLocation *)local_108;
    if ((CodeLocation *)local_90._0_8_ == local_118) {
      uStack_78 = local_108._8_8_;
      local_90._0_8_ = local_248;
    }
    uStack_7f = local_108._1_7_;
    local_90[0x10] = local_108[0];
    local_90._8_8_ = local_110;
    local_110 = 0;
    local_108[0] = 0;
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                    *)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 8),
                   (key_type *)local_90);
    iVar7 = 0x6e2130;
    if (cVar9._M_node !=
        (_Base_ptr)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 0x10))
    {
      pCVar10 = TypedTestSuitePState::GetCodeLocation
                          ((TypedTestSuitePState *)
                           bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_,
                           (string *)local_90);
      local_2b8 = &local_2a8;
      pcVar2 = (pCVar10->file)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,pcVar2,pcVar2 + (pCVar10->file)._M_string_length);
      local_298 = pCVar10->line;
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      local_2d8._M_dataplus._M_p = (pointer)0x16;
      local_390._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_390,(ulong)&local_2d8);
      local_390.field_2._M_allocated_capacity = (size_type)local_2d8._M_dataplus._M_p;
      *(undefined8 *)local_390._M_dataplus._M_p = 0x6543796669726556;
      *(undefined8 *)((long)local_390._M_dataplus._M_p + 8) = 0x7461636966697472;
      builtin_strncpy((char *)((long)local_390._M_dataplus._M_p + 0xe),"ateChain",8);
      local_390._M_string_length = (size_type)local_2d8._M_dataplus._M_p;
      local_390._M_dataplus._M_p[(long)local_2d8._M_dataplus._M_p] = '\0';
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_390);
      local_3b8 = &local_3a8;
      puVar16 = (ulong *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar16) {
        local_3a8._M_allocated_capacity = *puVar16;
        local_3a8._8_8_ = plVar11[3];
      }
      else {
        local_3a8._M_allocated_capacity = *puVar16;
        local_3b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11;
      }
      local_3b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar11[1];
      *plVar11 = (long)puVar16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_3b8);
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      puVar16 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar16) {
        local_348.field_2._M_allocated_capacity = *puVar16;
        local_348.field_2._8_8_ = puVar14[3];
      }
      else {
        local_348.field_2._M_allocated_capacity = *puVar16;
        local_348._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_348._M_string_length = puVar14[1];
      *puVar14 = puVar16;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_348);
      local_300 = (internal *)&local_2f0;
      piVar15 = (internal *)(plVar11 + 2);
      if ((internal *)*plVar11 == piVar15) {
        local_2f0 = *(pointer *)piVar15;
        lStack_2e8 = plVar11[3];
      }
      else {
        local_2f0 = *(pointer *)piVar15;
        local_300 = (internal *)*plVar11;
      }
      local_2f8 = (pointer)plVar11[1];
      *plVar11 = (long)piVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_300,**(ulong **)local_1f8);
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      puVar16 = (ulong *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar16) {
        local_370.field_2._M_allocated_capacity = *puVar16;
        local_370.field_2._8_8_ = plVar11[3];
      }
      else {
        local_370.field_2._M_allocated_capacity = *puVar16;
        local_370._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_370._M_string_length = plVar11[1];
      *plVar11 = (long)puVar16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      pcVar20 = strchr(pcVar8,0x2c);
      if (pcVar20 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_268,pcVar8,(allocator<char> *)&local_1f0);
        ptVar18 = extraout_RDX_08;
      }
      else {
        local_268 = &local_258;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,pcVar8,pcVar20);
        ptVar18 = extraout_RDX_07;
      }
      paVar23 = local_268;
      if (local_260 != (pointer)0x0) {
        pcVar20 = local_268->_M_local_buf + (long)local_260;
        do {
          paVar3 = local_268;
          iVar7 = isspace((uint)(byte)pcVar20[-1]);
          ptVar18 = extraout_RDX_09;
          paVar23 = paVar3;
          if (iVar7 == 0) break;
          pcVar21 = pcVar20 + -1;
          uVar19 = (long)pcVar21 - (long)paVar3;
          std::__cxx11::string::_M_erase((ulong)&local_268,uVar19);
          pcVar20 = local_268->_M_local_buf + uVar19;
          ptVar18 = extraout_RDX_10;
          paVar23 = local_268;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)pcVar21 != paVar3);
      }
      local_268 = &local_258;
      if (paVar23 == local_268) {
        local_2d8.field_2._8_8_ = local_258._8_8_;
        paVar23 = &local_2d8.field_2;
      }
      local_2d8.field_2._M_allocated_capacity = local_258._M_allocated_capacity;
      local_2d8._M_string_length = (size_type)local_260;
      local_260 = (pointer)0x0;
      local_258._M_allocated_capacity = local_258._M_allocated_capacity & 0xffffffffffffff00;
      local_2d8._M_dataplus._M_p = (pointer)paVar23;
      GetTypeName_abi_cxx11_
                (&local_1f0,
                 (internal *)
                 &bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate::typeinfo,
                 ptVar18);
      _Var24._M_p = local_1f0._M_dataplus._M_p;
      local_328.file._M_dataplus._M_p = (pointer)&local_328.file.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_328,local_2b8,local_2b0 + (long)local_2b8);
      iVar7 = local_298;
      paVar3 = local_2b8;
      local_328.line = local_298;
      bVar6 = IsTrue(true);
      if (!bVar6) {
        GTestLog::GTestLog((GTestLog *)&local_218,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                           ,0x201);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                   ,0x6a);
        if (paVar3 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
        }
        else {
          sVar12 = strlen(paVar3->_M_local_buf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,paVar3->_M_local_buf,sVar12);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
        std::ostream::operator<<((ostream *)&std::cerr,iVar7);
        GTestLog::~GTestLog((GTestLog *)&local_218);
      }
      iVar7 = local_298;
      paVar3 = local_2b8;
      bVar6 = IsTrue(true);
      if (!bVar6) {
        GTestLog::GTestLog((GTestLog *)&local_218,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                           ,0x216);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                   ,0x6f);
        if (paVar3 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
        }
        else {
          sVar12 = strlen(paVar3->_M_local_buf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,paVar3->_M_local_buf,sVar12);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
        std::ostream::operator<<((ostream *)&std::cerr,iVar7);
        GTestLog::~GTestLog((GTestLog *)&local_218);
      }
      pTVar13 = (TestFactoryBase *)operator_new(8);
      pTVar13->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006cbda0;
      MakeAndRegisterTestInfo
                (&local_370,paVar23->_M_local_buf,_Var24._M_p,(char *)0x0,&local_328,
                 &TypeIdHelper<bssl::PkitsTest09RequireExplicitPolicy<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
                  ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328.file._M_dataplus._M_p != &local_328.file.field_2) {
        operator_delete(local_328.file._M_dataplus._M_p,
                        local_328.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if (local_268 != &local_258) {
        operator_delete(local_268,local_258._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      if (local_300 != (internal *)&local_2f0) {
        operator_delete(local_300,(ulong)(local_2f0 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
      if (local_3b8 != &local_3a8) {
        operator_delete(local_3b8,local_3a8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
      }
      uVar5 = local_2a8._M_allocated_capacity;
      if (local_2b8 == &local_2a8) {
        local_1c0._8_8_ = local_2a8._8_8_;
        local_2b8 = &local_1c0;
      }
      local_1c0._M_allocated_capacity = local_2a8._M_allocated_capacity;
      local_1c8 = local_2b0;
      local_2b0 = 0;
      local_2a8._M_allocated_capacity = local_2a8._M_allocated_capacity & 0xffffffffffffff00;
      local_1b0 = local_298;
      paVar23 = &local_2a8;
      local_1d0 = local_2b8;
      if ((local_2b8 != &local_1c0) &&
         (local_2b8 = &local_2a8, operator_delete(local_1d0,uVar5 + 1), paVar23 = local_2b8,
         local_2b8 != &local_2a8)) {
        operator_delete(local_2b8,local_2a8._M_allocated_capacity + 1);
        paVar23 = local_2b8;
      }
      local_2b8 = paVar23;
      local_300 = (internal *)&local_2f0;
      if (local_290 == (internal *)&local_280) {
        lStack_2e8 = lStack_278;
      }
      else {
        local_300 = local_290;
      }
      local_2f0 = local_280;
      local_2f8 = local_288;
      local_288 = (pointer)0x0;
      local_280 = (pointer)((ulong)local_280 & 0xffffffffffffff00);
      local_2e0 = local_270;
      local_290 = (internal *)&local_280;
      pcVar8 = strchr(pcVar8,0x2c);
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        do {
          pbVar1 = (byte *)(pcVar8 + 1);
          pcVar8 = pcVar8 + 1;
          iVar7 = isspace((uint)*pbVar1);
        } while (iVar7 != 0);
      }
      RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest09RequireExplicitPolicy");
      pcVar20 = strchr(pcVar8,0x2c);
      if (pcVar20 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_108 + 0x10),pcVar8,(allocator<char> *)&local_328);
      }
      else {
        local_f8._M_allocated_capacity = (size_type)(local_108 + 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_108 + 0x10),pcVar8,pcVar20)
        ;
      }
      local_70._M_allocated_capacity = local_f8._M_allocated_capacity;
      if (local_f8._8_8_ != 0) {
        pcVar20 = (char *)(local_f8._8_8_ + local_f8._M_allocated_capacity);
        do {
          uVar5 = local_f8._M_allocated_capacity;
          iVar7 = isspace((uint)(byte)pcVar20[-1]);
          local_70._M_allocated_capacity = uVar5;
          if (iVar7 == 0) break;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar20 + -1);
          uVar19 = (long)paVar23 - uVar5;
          std::__cxx11::string::_M_erase((ulong)(local_108 + 0x10),uVar19);
          pcVar20 = (char *)(uVar19 + local_f8._M_allocated_capacity);
          local_70._M_allocated_capacity = local_f8._M_allocated_capacity;
        } while (paVar23 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)uVar5);
      }
      local_d8 = &local_60;
      local_f8._M_allocated_capacity = (size_type)(local_108 + 0x20);
      if (local_70._M_allocated_capacity == local_f8._M_allocated_capacity) {
        local_60._8_8_ = local_e8._8_8_;
        local_70._M_allocated_capacity = (size_type)local_d8;
      }
      local_60._M_allocated_capacity._1_7_ = local_e8._M_allocated_capacity._1_7_;
      local_60._M_local_buf[0] = local_e8._M_local_buf[0];
      local_70._8_8_ = local_f8._8_8_;
      local_f8._8_8_ = 0;
      local_e8._M_local_buf[0] = 0;
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                      *)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 8)
                     ,(key_type *)&local_70);
      iVar7 = 0x6e2130;
      if (cVar9._M_node !=
          (_Base_ptr)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 0x10)
         ) {
        pCVar10 = TypedTestSuitePState::GetCodeLocation
                            ((TypedTestSuitePState *)
                             bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_,
                             (string *)&local_70);
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
        pcVar2 = (pCVar10->file)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_370,pcVar2,pcVar2 + (pCVar10->file)._M_string_length);
        local_350 = pCVar10->line;
        local_268 = &local_258;
        local_1f0._M_dataplus._M_p = (pointer)0x16;
        local_268 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)std::__cxx11::string::_M_create((ulong *)&local_268,(ulong)&local_1f0);
        local_258._M_allocated_capacity = (size_type)local_1f0._M_dataplus._M_p;
        local_268->_M_allocated_capacity = 0x6543796669726556;
        (&local_268->_M_allocated_capacity)[1] = 0x7461636966697472;
        *(char *)((long)local_268 + 0xe) = 'a';
        *(char *)((long)local_268 + 0xf) = 't';
        *(char *)((long)local_268 + 0x10) = 'e';
        *(char *)((long)local_268 + 0x11) = 'C';
        *(char *)((long)local_268 + 0x12) = 'h';
        *(char *)((long)local_268 + 0x13) = 'a';
        *(char *)((long)local_268 + 0x14) = 'i';
        *(char *)((long)local_268 + 0x15) = 'n';
        local_260 = local_1f0._M_dataplus._M_p;
        local_268->_M_local_buf[(long)local_1f0._M_dataplus._M_p] = '\0';
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_268);
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
        psVar17 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_2d8.field_2._M_allocated_capacity = *psVar17;
          local_2d8.field_2._8_8_ = plVar11[3];
        }
        else {
          local_2d8.field_2._M_allocated_capacity = *psVar17;
          local_2d8._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_2d8._M_string_length = plVar11[1];
        *plVar11 = (long)psVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_2d8);
        local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
        psVar17 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_390.field_2._M_allocated_capacity = *psVar17;
          local_390.field_2._8_8_ = plVar11[3];
        }
        else {
          local_390.field_2._M_allocated_capacity = *psVar17;
          local_390._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_390._M_string_length = plVar11[1];
        *plVar11 = (long)psVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_390);
        local_3b8 = &local_3a8;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar23) {
          local_3a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
          local_3a8._8_8_ = plVar11[3];
        }
        else {
          local_3a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
          local_3b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar11;
        }
        local_3b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar11[1];
        *plVar11 = (long)paVar23;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_3b8,**(ulong **)local_1f8);
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        psVar17 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_348.field_2._M_allocated_capacity = *psVar17;
          local_348.field_2._8_8_ = plVar11[3];
        }
        else {
          local_348.field_2._M_allocated_capacity = *psVar17;
          local_348._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_348._M_string_length = plVar11[1];
        *plVar11 = (long)psVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        pcVar20 = strchr(pcVar8,0x2c);
        if (pcVar20 == (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_218,pcVar8,(allocator<char> *)&local_50);
          ptVar18 = extraout_RDX_12;
        }
        else {
          local_218 = &local_208;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,pcVar8,pcVar20);
          ptVar18 = extraout_RDX_11;
        }
        paVar23 = local_218;
        if (local_210 != 0) {
          pcVar8 = local_218->_M_local_buf + local_210;
          do {
            paVar3 = local_218;
            iVar7 = isspace((uint)(byte)pcVar8[-1]);
            ptVar18 = extraout_RDX_13;
            paVar23 = paVar3;
            if (iVar7 == 0) break;
            pcVar20 = pcVar8 + -1;
            uVar19 = (long)pcVar20 - (long)paVar3;
            std::__cxx11::string::_M_erase((ulong)&local_218,uVar19);
            pcVar8 = local_218->_M_local_buf + uVar19;
            ptVar18 = extraout_RDX_14;
            paVar23 = local_218;
          } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)pcVar20 != paVar3);
        }
        if (paVar23 == &local_208) {
          local_1f0.field_2._8_8_ = local_208._8_8_;
          paVar23 = &local_1f0.field_2;
        }
        local_1f0.field_2._M_allocated_capacity._1_7_ = local_208._M_allocated_capacity._1_7_;
        local_1f0.field_2._M_local_buf[0] = local_208._M_local_buf[0];
        local_1f0._M_string_length = local_210;
        local_210 = 0;
        local_208._M_local_buf[0] = '\0';
        local_218 = &local_208;
        local_1f0._M_dataplus._M_p = (pointer)paVar23;
        GetTypeName_abi_cxx11_
                  (&local_50,
                   (internal *)
                   &bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate::typeinfo,
                   ptVar18);
        _Var4._M_p = local_50._M_dataplus._M_p;
        local_328.file._M_dataplus._M_p = (pointer)&local_328.file.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_328,local_370._M_dataplus._M_p,
                   local_370._M_dataplus._M_p + local_370._M_string_length);
        iVar7 = local_350;
        _Var24._M_p = local_370._M_dataplus._M_p;
        local_328.line = local_350;
        bVar6 = IsTrue(true);
        if (!bVar6) {
          GTestLog::GTestLog(&local_394,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x201);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                     ,0x6a);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var24._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
          }
          else {
            sVar12 = strlen(_Var24._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,_Var24._M_p,sVar12);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
          std::ostream::operator<<((ostream *)&std::cerr,iVar7);
          GTestLog::~GTestLog(&local_394);
        }
        iVar7 = local_350;
        _Var24._M_p = local_370._M_dataplus._M_p;
        bVar6 = IsTrue(true);
        if (!bVar6) {
          GTestLog::GTestLog(&local_394,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x216);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                     ,0x6f);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var24._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
          }
          else {
            sVar12 = strlen(_Var24._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,_Var24._M_p,sVar12);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
          std::ostream::operator<<((ostream *)&std::cerr,iVar7);
          GTestLog::~GTestLog(&local_394);
        }
        pTVar13 = (TestFactoryBase *)operator_new(8);
        pTVar13->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006cbe68;
        MakeAndRegisterTestInfo
                  (&local_348,paVar23->_M_local_buf,_Var4._M_p,(char *)0x0,&local_328,
                   &TypeIdHelper<bssl::PkitsTest09RequireExplicitPolicy<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
                    ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328.file._M_dataplus._M_p != &local_328.file.field_2) {
          operator_delete(local_328.file._M_dataplus._M_p,
                          local_328.file.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        if (local_218 != &local_208) {
          operator_delete(local_218,
                          CONCAT71(local_208._M_allocated_capacity._1_7_,local_208._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        if (local_3b8 != &local_3a8) {
          operator_delete(local_3b8,local_3a8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != &local_390.field_2) {
          operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
        }
        if (local_268 != &local_258) {
          operator_delete(local_268,local_258._M_allocated_capacity + 1);
        }
        uVar5 = local_370.field_2._M_allocated_capacity;
        paVar23 = &local_370.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p == paVar23) {
          local_1c0._8_8_ = local_370.field_2._8_8_;
          local_370._M_dataplus._M_p = (pointer)&local_1c0;
        }
        local_1c0._M_allocated_capacity = local_370.field_2._M_allocated_capacity;
        local_1c8 = local_370._M_string_length;
        local_370._M_string_length = 0;
        local_370.field_2._M_allocated_capacity =
             local_370.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_1b0 = local_350;
        _Var24._M_p = (pointer)paVar23;
        local_1d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_370._M_dataplus._M_p;
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_370._M_dataplus._M_p != &local_1c0) &&
           (local_370._M_dataplus._M_p = (pointer)paVar23, operator_delete(local_1d0,uVar5 + 1),
           _Var24._M_p = local_370._M_dataplus._M_p,
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_370._M_dataplus._M_p != paVar23)) {
          operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
          _Var24._M_p = local_370._M_dataplus._M_p;
        }
        local_370._M_dataplus._M_p = _Var24._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_allocated_capacity != &local_60) {
          operator_delete((void *)local_70._M_allocated_capacity,local_60._M_allocated_capacity + 1)
          ;
        }
        if (local_300 != (internal *)&local_2f0) {
          operator_delete(local_300,(ulong)(local_2f0 + 1));
        }
        if ((CodeLocation *)local_90._0_8_ != (CodeLocation *)(local_90 + 0x10)) {
          operator_delete((void *)local_90._0_8_,stack0xffffffffffffff80 + 1);
        }
        if (local_290 != (internal *)&local_280) {
          operator_delete(local_290,(ulong)(local_280 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_1a8 != (internal *)&local_198) {
          operator_delete(local_1a8,(ulong)(local_198 + 1));
        }
        paVar23 = &local_d0.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar23) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          paVar23 = extraout_RAX;
        }
        return SUB81(paVar23,0);
      }
      goto LAB_003fc6e3;
    }
  }
  FormatFileLocation_abi_cxx11_(&local_328.file,local_290,(char *)(ulong)local_270,iVar7);
  TypeParameterizedTestSuite<bssl::PkitsTest09RequireExplicitPolicy,testing::internal::Templates<bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidRequireExplicitPolicyTest5,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9ValidSelfIssuedrequireExplicitPolicyTest6,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest7,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest8>,testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
  ::Register();
LAB_003fc6e3:
  FormatFileLocation_abi_cxx11_(&local_328.file,local_300,(char *)(ulong)local_2e0,iVar7);
  TypeParameterizedTestSuite<bssl::PkitsTest09RequireExplicitPolicy,testing::internal::Templates<bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidRequireExplicitPolicyTest5,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9ValidSelfIssuedrequireExplicitPolicyTest6,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest7,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest8>,testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
  ::Register();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_allocated_capacity != &local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,local_d8->_M_allocated_capacity + 1);
  }
  if (local_300 != (internal *)&local_2f0) {
    operator_delete(local_300,(ulong)(local_2f0 + 1));
  }
  if ((CodeLocation *)local_90._0_8_ != (CodeLocation *)(local_90 + 0x10)) {
    operator_delete((void *)local_90._0_8_,(ulong)((local_248->file)._M_dataplus._M_p + 1));
  }
  if (local_290 != (internal *)&local_280) {
    operator_delete(local_290,(ulong)(local_280 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_1a8 != (internal *)&local_198) {
    operator_delete(local_1a8,(ulong)(local_198 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const TypedTestSuitePState* state, const char* case_name,
                       const char* test_names,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    RegisterTypeParameterizedTestSuiteInstantiation(case_name);
    std::string test_name =
        StripTrailingSpaces(GetPrefixUntilComma(test_names));
    if (!state->TestExists(test_name)) {
      fprintf(stderr, "Failed to get code location for test %s.%s at %s.",
              case_name, test_name.c_str(),
              FormatFileLocation(code_location.file.c_str(), code_location.line)
                  .c_str());
      fflush(stderr);
      posix::Abort();
    }
    const CodeLocation& test_location = state->GetCodeLocation(test_name);

    typedef typename Tests::Head Head;

    // First, register the first test in 'Test' for each type in 'Types'.
    TypeParameterizedTest<Fixture, Head, Types>::Register(
        prefix, test_location, case_name, test_names, 0, type_names);

    // Next, recurses (at compile time) with the tail of the test list.
    return TypeParameterizedTestSuite<Fixture, typename Tests::Tail,
                                      Types>::Register(prefix,
                                                       std::move(code_location),
                                                       state, case_name,
                                                       SkipComma(test_names),
                                                       type_names);
  }